

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O3

void __thiscall
btAxisSweep3Internal<unsigned_int>::setAabb
          (btAxisSweep3Internal<unsigned_int> *this,btBroadphaseProxy *proxy,btVector3 *aabbMin,
          btVector3 *aabbMax,btDispatcher *dispatcher)

{
  btDbvtBroadphase *pbVar1;
  undefined8 uVar2;
  
  uVar2 = *(undefined8 *)(aabbMin->m_floats + 2);
  *(undefined8 *)(proxy->m_aabbMin).m_floats = *(undefined8 *)aabbMin->m_floats;
  *(undefined8 *)((proxy->m_aabbMin).m_floats + 2) = uVar2;
  uVar2 = *(undefined8 *)(aabbMax->m_floats + 2);
  *(undefined8 *)(proxy->m_aabbMax).m_floats = *(undefined8 *)aabbMax->m_floats;
  *(undefined8 *)((proxy->m_aabbMax).m_floats + 2) = uVar2;
  updateHandle(this,proxy->m_uniqueId,aabbMin,aabbMax,dispatcher);
  pbVar1 = this->m_raycastAccelerator;
  if (pbVar1 != (btDbvtBroadphase *)0x0) {
    uVar2._0_4_ = proxy[1].m_uniqueId;
    uVar2._4_4_ = proxy[1].m_aabbMin.m_floats[0];
    (*(pbVar1->super_btBroadphaseInterface)._vptr_btBroadphaseInterface[4])
              (pbVar1,uVar2,aabbMin,aabbMax,dispatcher);
    return;
  }
  return;
}

Assistant:

void	btAxisSweep3Internal<BP_FP_INT_TYPE>::setAabb(btBroadphaseProxy* proxy,const btVector3& aabbMin,const btVector3& aabbMax,btDispatcher* dispatcher)
{
	Handle* handle = static_cast<Handle*>(proxy);
	handle->m_aabbMin = aabbMin;
	handle->m_aabbMax = aabbMax;
	updateHandle(static_cast<BP_FP_INT_TYPE>(handle->m_uniqueId), aabbMin, aabbMax,dispatcher);
	if (m_raycastAccelerator)
		m_raycastAccelerator->setAabb(handle->m_dbvtProxy,aabbMin,aabbMax,dispatcher);

}